

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

void ssh_throttle_conn(Ssh *ssh,int adjust)

{
  int iVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  
  iVar1 = ssh[-0x16].dummy;
  iVar4 = adjust + iVar1;
  ssh[-0x16].dummy = iVar4;
  if (iVar4 < 0) {
    __assert_fail("srv->conn_throttle_count >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/server.c",
                  0xd1,"void ssh_throttle_conn(Ssh *, int)");
  }
  if ((iVar1 != 0) == (iVar4 == 0)) {
    bVar3 = iVar1 == 0 && iVar4 != 0;
    *(bool *)&ssh[-0x15].dummy = bVar3;
    plVar2 = *(long **)(ssh + -0x1a);
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x28))(plVar2,bVar3);
      queue_idempotent_callback((IdempotentCallback *)(*(long *)(ssh + 4) + 0xa8));
      return;
    }
  }
  return;
}

Assistant:

void ssh_throttle_conn(Ssh *ssh, int adjust)
{
    server *srv = container_of(ssh, server, ssh);
    int old_count = srv->conn_throttle_count;
    bool frozen;

    srv->conn_throttle_count += adjust;
    assert(srv->conn_throttle_count >= 0);

    if (srv->conn_throttle_count && !old_count) {
        frozen = true;
    } else if (!srv->conn_throttle_count && old_count) {
        frozen = false;
    } else {
        return;                /* don't change current frozen state */
    }

    srv->frozen = frozen;

    if (srv->socket) {
        sk_set_frozen(srv->socket, frozen);

        /*
         * Now process any SSH connection data that was stashed in our
         * queue while we were frozen.
         */
        queue_idempotent_callback(&srv->bpp->ic_in_raw);
    }
}